

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

void param_update(void *filename)

{
  int iVar1;
  double dVar2;
  undefined1 local_1b0 [8];
  stat status;
  int i;
  int __not_first_call;
  void *__cancel_arg;
  _func_void_void_ptr *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  stat prev_status;
  void *filename_local;
  
  yprintf(OUTPUT_LV_INFO,"Parameter updater started. Watching %s\n",filename);
  status.__glibc_reserved[2]._4_4_ = __sigsetjmp(&__cancel_routine,0);
  if (status.__glibc_reserved[2]._4_4_ != 0) {
    param_update_loop_cleanup(filename);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine);
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine);
  stat((char *)filename,(stat *)(__cancel_buf.__pad + 3));
  do {
    for (status.__glibc_reserved[2]._0_4_ = 0; (int)status.__glibc_reserved[2] < 3;
        status.__glibc_reserved[2]._0_4_ = (int)status.__glibc_reserved[2] + 1) {
      yp_usleep(100000);
      pthread_testcancel();
    }
    g_param.parameter_applying = 0;
    stat((char *)filename,(stat *)local_1b0);
    dVar2 = difftime(status.st_atim.tv_nsec,prev_status.st_atim.tv_nsec);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      yp_usleep(100000);
      set_param((char *)filename,(char *)0x0);
      iVar1 = option(OPTION_PARAM_CONTROL);
      if (iVar1 == 0) {
        g_param.parameter_applying = 1;
        apply_robot_params();
      }
    }
    memcpy(__cancel_buf.__pad + 3,local_1b0,0x90);
  } while( true );
}

Assistant:

void param_update(void* filename)
{
  struct stat prev_status;

  yprintf(OUTPUT_LV_INFO, "Parameter updater started. Watching %s\n", filename);
  pthread_cleanup_push(param_update_loop_cleanup, filename);

  stat(filename, &prev_status);

  while (1)
  {
    int i;
    struct stat status;

    // 0.3秒に一回パラメータファイル更新をチェック
    for (i = 0; i < 3; i++)
    {
      yp_usleep(100000);
      pthread_testcancel();
    }
    g_param.parameter_applying = 0;
    stat(filename, &status);

    if (difftime(status.st_mtime, prev_status.st_mtime) != 0.0)
    {
      yp_usleep(100000);
      set_param(filename, NULL);
      if (!(option(OPTION_PARAM_CONTROL)))
      {
        g_param.parameter_applying = 1;
        apply_robot_params();
      }
    }

    prev_status = status;
  }
  pthread_cleanup_pop(1);
}